

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O1

bool slang::ast::Lookup::findTempVar
               (Scope *scope,TempVarSymbol *symbol,NameSyntax *syntax,LookupResult *result)

{
  char *pcVar1;
  SyntaxKind SVar2;
  Scope *__n;
  NameComponents name;
  void *__s2;
  span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> nameParts_00;
  not_null<const_slang::ast::Scope_*> nVar3;
  bool bVar4;
  int iVar5;
  int colonParts;
  SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> nameParts;
  int local_20c;
  underlying_type local_208;
  Symbol *pSStack_200;
  TempVarSymbol *local_1f8;
  RandomizeDetails *pRStack_1f0;
  AssertionInstanceDetails *local_1e8;
  Scope *local_1d8;
  underlying_type local_1c8;
  Symbol *pSStack_1c0;
  TempVarSymbol *local_1b8;
  RandomizeDetails *pRStack_1b0;
  AssertionInstanceDetails *local_1a8;
  ASTContext local_1a0;
  SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> local_168 [3];
  
  local_20c = 0;
  pcVar1 = local_168[0].firstElement;
  local_168[0].len = 0;
  local_168[0].cap = 4;
  local_168[0].data_ = (pointer)pcVar1;
  if (((syntax->super_ExpressionSyntax).super_SyntaxNode.kind != ScopedName) ||
     (syntax = anon_unknown_39::splitScopedName((ScopedNameSyntax *)syntax,local_168,&local_20c),
     local_20c == 0)) {
    local_1f8 = (TempVarSymbol *)0x0;
    pRStack_1f0 = (RandomizeDetails *)0x0;
    local_208 = 0;
    pSStack_200 = (Symbol *)0x0;
    local_1e8 = (AssertionInstanceDetails *)0x0;
    SVar2 = (syntax->super_ExpressionSyntax).super_SyntaxNode.kind;
    if ((SVar2 - IdentifierName < 2) || (SVar2 == ClassName)) {
      anon_unknown_39::NameComponents::NameComponents((NameComponents *)&local_1a0,syntax);
      nVar3.ptr = local_1a0.scope.ptr;
      __s2 = (void *)CONCAT44(local_1a0._12_4_,local_1a0.lookupIndex);
      local_208 = local_1a0.flags.m_bits;
      pSStack_200 = local_1a0.instanceOrProc;
      local_1f8 = local_1a0.firstTempVar;
      pRStack_1f0 = local_1a0.randomizeDetails;
      local_1e8 = local_1a0.assertionInstance;
      do {
        __n = (Scope *)(symbol->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_len;
        if ((__n == nVar3.ptr) &&
           ((__n == (Scope *)0x0 ||
            (iVar5 = bcmp((symbol->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_str,
                          __s2,(size_t)__n), iVar5 == 0)))) {
          result->found = (Symbol *)symbol;
          break;
        }
        symbol = symbol->nextTemp;
      } while (symbol != (TempVarSymbol *)0x0);
      if (result->found != (Symbol *)0x0) {
        local_1a0.lookupIndex = 0xffffffff;
        local_1a0.flags.m_bits = 0;
        local_1a0.instanceOrProc = (Symbol *)0x0;
        local_1a0.firstTempVar = (TempVarSymbol *)0x0;
        local_1a0.randomizeDetails = (RandomizeDetails *)0x0;
        local_1a0.assertionInstance = (AssertionInstanceDetails *)0x0;
        nameParts_00._M_extent._M_extent_value = local_168[0].len;
        nameParts_00._M_ptr = local_168[0].data_;
        local_1d8 = nVar3.ptr;
        local_1c8 = local_208;
        pSStack_1c0 = pSStack_200;
        local_1b8 = local_1f8;
        pRStack_1b0 = pRStack_1f0;
        local_1a8 = local_1e8;
        name.text._M_str = (char *)__s2;
        name.text._M_len = (size_t)nVar3.ptr;
        name.range.startLoc = (SourceLocation)local_208;
        name.range.endLoc = (SourceLocation)pSStack_200;
        name.selectors._M_ptr = (pointer)local_1f8;
        name.selectors._M_extent._M_extent_value = (size_t)pRStack_1f0;
        name.paramAssignments = (ParameterValueAssignmentSyntax *)local_1e8;
        local_1a0.scope.ptr = scope;
        bVar4 = anon_unknown_39::lookupDownward
                          (nameParts_00,name,&local_1a0,(bitmask<slang::ast::LookupFlags>)0x0,result
                          );
        goto LAB_002459d0;
      }
    }
  }
  bVar4 = false;
LAB_002459d0:
  if (local_168[0].data_ != (pointer)pcVar1) {
    operator_delete(local_168[0].data_);
  }
  return bVar4;
}

Assistant:

bool Lookup::findTempVar(const Scope& scope, const TempVarSymbol& symbol, const NameSyntax& syntax,
                         LookupResult& result) {
    int colonParts = 0;
    SmallVector<NamePlusLoc, 4> nameParts;
    const NameSyntax* first = &syntax;
    if (syntax.kind == SyntaxKind::ScopedName) {
        first = splitScopedName(syntax.as<ScopedNameSyntax>(), nameParts, colonParts);
        if (colonParts)
            return false;
    }

    NameComponents name;
    switch (first->kind) {
        case SyntaxKind::IdentifierName:
        case SyntaxKind::IdentifierSelectName:
        case SyntaxKind::ClassName:
            name = *first;
            break;
        default:
            return false;
    }

    const TempVarSymbol* curr = &symbol;
    do {
        if (curr->name == name.text) {
            result.found = curr;
            break;
        }
        curr = curr->nextTemp;
    } while (curr);

    if (!result.found)
        return false;

    ASTContext context(scope, LookupLocation::max);
    return lookupDownward(nameParts, name, context, LookupFlags::None, result);
}